

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::OptionParseException::OptionParseException(OptionParseException *this,string *message)

{
  string local_38;
  string *local_18;
  string *message_local;
  OptionParseException *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)message);
  OptionException::OptionException(&this->super_OptionException,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_OptionException = &PTR__OptionParseException_00257408;
  return;
}

Assistant:

explicit OptionParseException(const std::string& message)
    : OptionException(message)
    {
    }